

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish.cpp
# Opt level: O2

int __thiscall ncnn::HardSwish::load_param(HardSwish *this,ParamDict *pd)

{
  float fVar1;
  float fVar2;
  
  fVar1 = ParamDict::get(pd,0,0.2);
  this->alpha = fVar1;
  fVar1 = ParamDict::get(pd,1,0.5);
  this->beta = fVar1;
  fVar2 = 1.0 / this->alpha;
  fVar1 = -fVar1 * fVar2;
  this->lower = fVar1;
  this->upper = fVar1 + fVar2;
  return 0;
}

Assistant:

int HardSwish::load_param(const ParamDict& pd)
{
    // Note that tensorflow/pytorch use alpha,beta = 1/6, 0.5, not the default value here.
    // You can setup them manually in .param file.
    alpha = pd.get(0, 0.2f);
    beta = pd.get(1, 0.5f);
    lower = -beta / alpha;
    upper = (1.f / alpha) + lower;

    return 0;
}